

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

void __thiscall mau::DeliveryCommonData::DeliveryCommonData(DeliveryCommonData *this)

{
  logger::Channel::Channel(&this->Logger,"MauProxy",Trace);
  (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Socket)._M_t.
  super___uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  .
  super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
  ._M_head_impl =
       (basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)0x0;
  (this->ReadBufferAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->ReadBufferAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)
   ((long)&(this->ReadBufferAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex + 0x10
   ) = 0;
  (this->ReadBufferAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (this->ReadBufferAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (this->ReadBufferAllocator).AllocatorLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind =
       1;
  pktalloc::Allocator::Allocator(&(this->ReadBufferAllocator).Allocator);
  (this->LastResult)._M_i = Mau_Success;
  (this->ChannelConfig).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->ChannelConfig).TheLock.cs.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ChannelConfig).TheLock.cs.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  *(undefined8 *)
   ((long)&(this->ChannelConfig).TheLock.cs.super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->ChannelConfig).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->ChannelConfig).TheLock.cs.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->ChannelConfig).Value.RNGSeed = 1;
  (this->ChannelConfig).Value.LossRate = 0.01;
  (this->ChannelConfig).Value.DeliveryRate = 0.5;
  (this->ChannelConfig).Value.Router_MBPS = 1.0;
  (this->ChannelConfig).Value.Router_QueueMsec = 100;
  (this->ChannelConfig).Value.Router_RED_Enable = true;
  (this->ChannelConfig).Value.Router_RED_QueueFraction = 0.5;
  (this->ChannelConfig).Value.Router_RED_MaxPLR = 0.02;
  (this->ChannelConfig).Value.LightSpeedMsec = 0x14;
  (this->ChannelConfig).Value.ReorderMinimumLatencyMsec = 0x32;
  (this->ChannelConfig).Value.ReorderMaximumLatencyMsec = 0x96;
  (this->ChannelConfig).Value.ReorderRate = 0.005;
  (this->ChannelConfig).Value.OrderRate = 0.3;
  (this->ChannelConfig).Value.DuplicateRate = 0.001;
  (this->ChannelConfig).Value.CorruptionRate = 0.001;
  (this->ProxyConfig).Version = 3;
  (this->ProxyConfig).UDPSendBufferSizeBytes = 64000;
  (this->ProxyConfig).UDPRecvBufferSizeBytes = 64000;
  (this->ProxyConfig).UDPListenPort = 0x27d8;
  (this->ProxyConfig).MaxDatagramBytes = 0x5dc;
  (this->ProxyConfig).SendHookContext = (MauAppContextPtr)SUB168(ZEXT816(0) << 0x20,0);
  (this->ProxyConfig).SendHook = (MauSendHookFunction)SUB168(ZEXT816(0) << 0x20,8);
  return;
}

Assistant:

DeliveryCommonData::DeliveryCommonData()
    : Logger("MauProxy", MinimumLogLevel)
{
}